

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_rectangles.cpp
# Opt level: O0

Node * __thiscall Rectangles::update(Rectangles *this,Node *root)

{
  vec2 vVar1;
  vec4 color_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  Renderer *renderer;
  TextureNode *this_00;
  reference ppTVar7;
  Node *child;
  rect2d rect_00;
  uint local_c8;
  uint local_c4;
  RectangleNode *rect;
  vec4 color;
  TextureNode *tn;
  rect2d geometry;
  int i_1;
  int count;
  int h;
  int w;
  int rh;
  int rw;
  vec2 s;
  Texture *local_28;
  uint local_20;
  uint local_1c;
  uint i;
  uint textureCount;
  Node *root_local;
  Rectangles *this_local;
  
  if (interleaved) {
    local_c4 = nodeCount / 2;
  }
  else {
    if (textured) {
      local_c8 = nodeCount;
    }
    else {
      local_c8 = 0;
    }
    local_c4 = local_c8;
  }
  local_1c = local_c4;
  _i = root;
  root_local = (Node *)this;
  sVar6 = std::vector<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>::size(&texturePool);
  if (sVar6 != local_1c) {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      renderer = rengine::StandardSurface::renderer(&this->super_StandardSurface);
      rengine::vec2::vec2(&s,100.0,20.0);
      local_28 = rengine::rengine_fractalTexture(renderer,s);
      std::vector<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>::push_back
                (&texturePool,&local_28);
    }
  }
  if (_i != (Node *)0x0) {
    (*(_i->super_SignalEmitter)._vptr_SignalEmitter[2])();
  }
  rengine::rengine_countFps();
  _i = rengine::Node::create();
  vVar1 = rengine::Surface::size((Surface *)this);
  iVar2 = nodeCount;
  rh = (int)vVar1.x;
  rw = (int)vVar1.y;
  for (geometry.br.x = 0.0; (int)geometry.br.x < iVar2;
      geometry.br.x = (float)((int)geometry.br.x + 1)) {
    iVar3 = rand();
    iVar4 = rand();
    rect_00 = rengine::rect2d::fromXywh
                        ((float)(iVar3 % (int)((float)rh - 100.0)),
                         (float)(iVar4 % (int)((float)rw - 20.0)),100.0,20.0);
    if (((textured & 1U) == 0) && (((interleaved & 1U) == 0 || ((int)geometry.br.x % 2 != 1)))) {
      iVar3 = rand();
      iVar4 = rand();
      iVar5 = rand();
      rengine::vec4::vec4((vec4 *)&rect,(float)(iVar3 % 100) / 100.0,(float)(iVar4 % 100) / 100.0,
                          (float)(iVar5 % 100) / 100.0,0.9);
      child = (Node *)rengine::RectangleNode::create();
      rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)child,rect_00);
      color_00.z = color.x;
      color_00.w = color.y;
      color_00._0_8_ = rect;
      rengine::RectangleNode::setColor((RectangleNode *)child,color_00);
      rengine::Node::operator<<(_i,child);
    }
    else {
      this_00 = rengine::TextureNode::create();
      color._8_8_ = rect_00.tl;
      rengine::RectangleNodeBase::setGeometry(&this_00->super_RectangleNodeBase,rect_00);
      ppTVar7 = std::vector<rengine::Texture_*,_std::allocator<rengine::Texture_*>_>::operator[]
                          (&texturePool,(long)((int)geometry.br.x / 2));
      rengine::TextureNode::setTexture(this_00,*ppTVar7);
      rengine::Node::operator<<(_i,(Node *)this_00);
    }
  }
  rengine::Surface::requestRender((Surface *)this);
  return _i;
}

Assistant:

Node *update(Node *root) override {

        // if --textures, we have nodeCount textures (all the nodes)
        // if --interleaved, we have half of them.
        const unsigned int textureCount = interleaved ? nodeCount / 2 : (textured ? nodeCount : 0);

        if (texturePool.size() != textureCount) {
            for (unsigned int i=0; i<textureCount; ++i) {
                texturePool.push_back(rengine_fractalTexture(renderer(), vec2(100, 20)));
            }
        }

        if (root)
            root->destroy();

        rengine_countFps();

        root = Node::create();

        vec2 s = size();

        int rw = 100;
        int rh = 20;
        int w = s.x - rw;
        int h = s.y - rh;

        int count = nodeCount;

        for (int i=0; i<count; ++i) {

            rect2d geometry = rect2d::fromXywh(rand() % w, rand() % h, rw, rh);

            if (textured || (interleaved && (i % 2) == 1)) {
                TextureNode *tn = TextureNode::create();
                tn->setGeometry(geometry);
                tn->setTexture(texturePool[i / 2]);
                *root << tn;
            } else {
                vec4 color((rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           (rand() % 100)/100.0,
                           0.9);
                RectangleNode *rect = RectangleNode::create();
                rect->setGeometry(geometry);
                rect->setColor(color);
                *root << rect;
            }
        }

        requestRender();

        return root;
    }